

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcBooleanClippingResult::~IfcBooleanClippingResult
          (IfcBooleanClippingResult *this)

{
  ~IfcBooleanClippingResult
            ((IfcBooleanClippingResult *)
             &this[-1].super_IfcBooleanResult.super_IfcGeometricRepresentationItem.field_0x28);
  return;
}

Assistant:

IfcBooleanClippingResult() : Object("IfcBooleanClippingResult") {}